

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_12::PathVerifier::ApplyPolicyConstraints
          (PathVerifier *this,ParsedCertificate *cert)

{
  bool bVar1;
  ParsedPolicyConstraints *pPVar2;
  optional *this_00;
  optional<unsigned_char> *poVar3;
  byte *pbVar4;
  ParsedCertificate *cert_local;
  PathVerifier *this_local;
  
  bVar1 = ParsedCertificate::has_policy_constraints(cert);
  if (bVar1) {
    pPVar2 = ParsedCertificate::policy_constraints(cert);
    bVar1 = ::std::optional::operator_cast_to_bool((optional *)pPVar2);
    if (bVar1) {
      pPVar2 = ParsedCertificate::policy_constraints(cert);
      pbVar4 = ::std::optional<unsigned_char>::value(&pPVar2->require_explicit_policy);
      if ((ulong)*pbVar4 < this->explicit_policy_) {
        pPVar2 = ParsedCertificate::policy_constraints(cert);
        pbVar4 = ::std::optional<unsigned_char>::value(&pPVar2->require_explicit_policy);
        this->explicit_policy_ = (ulong)*pbVar4;
      }
    }
    pPVar2 = ParsedCertificate::policy_constraints(cert);
    bVar1 = ::std::optional::operator_cast_to_bool((optional *)&pPVar2->inhibit_policy_mapping);
    if (bVar1) {
      pPVar2 = ParsedCertificate::policy_constraints(cert);
      pbVar4 = ::std::optional<unsigned_char>::value(&pPVar2->inhibit_policy_mapping);
      if ((ulong)*pbVar4 < this->policy_mapping_) {
        pPVar2 = ParsedCertificate::policy_constraints(cert);
        pbVar4 = ::std::optional<unsigned_char>::value(&pPVar2->inhibit_policy_mapping);
        this->policy_mapping_ = (ulong)*pbVar4;
      }
    }
  }
  this_00 = (optional *)ParsedCertificate::inhibit_any_policy(cert);
  bVar1 = ::std::optional::operator_cast_to_bool(this_00);
  if (bVar1) {
    poVar3 = ParsedCertificate::inhibit_any_policy(cert);
    pbVar4 = ::std::optional<unsigned_char>::value(poVar3);
    if ((ulong)*pbVar4 < this->inhibit_any_policy_) {
      poVar3 = ParsedCertificate::inhibit_any_policy(cert);
      pbVar4 = ::std::optional<unsigned_char>::value(poVar3);
      this->inhibit_any_policy_ = (ulong)*pbVar4;
    }
  }
  return;
}

Assistant:

void PathVerifier::ApplyPolicyConstraints(const ParsedCertificate &cert) {
  // RFC 5280 section 6.1.4 step i-j:
  //      (i)  If a policy constraints extension is included in the
  //           certificate, modify the explicit_policy and policy_mapping
  //           state variables as follows:
  if (cert.has_policy_constraints()) {
    //         (1)  If requireExplicitPolicy is present and is less than
    //              explicit_policy, set explicit_policy to the value of
    //              requireExplicitPolicy.
    if (cert.policy_constraints().require_explicit_policy &&
        cert.policy_constraints().require_explicit_policy.value() <
            explicit_policy_) {
      explicit_policy_ =
          cert.policy_constraints().require_explicit_policy.value();
    }

    //         (2)  If inhibitPolicyMapping is present and is less than
    //              policy_mapping, set policy_mapping to the value of
    //              inhibitPolicyMapping.
    if (cert.policy_constraints().inhibit_policy_mapping &&
        cert.policy_constraints().inhibit_policy_mapping.value() <
            policy_mapping_) {
      policy_mapping_ =
          cert.policy_constraints().inhibit_policy_mapping.value();
    }
  }

  //      (j)  If the inhibitAnyPolicy extension is included in the
  //           certificate and is less than inhibit_anyPolicy, set
  //           inhibit_anyPolicy to the value of inhibitAnyPolicy.
  if (cert.inhibit_any_policy() &&
      cert.inhibit_any_policy().value() < inhibit_any_policy_) {
    inhibit_any_policy_ = cert.inhibit_any_policy().value();
  }
}